

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct::forward(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint _h;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  float *pfVar11;
  int i;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  void *pvVar17;
  int p;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  int q;
  void *pvVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  int local_f8;
  Mat local_78;
  
  if ((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 1)) {
    iVar12 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar12;
  }
  iVar12 = this->num_output;
  uVar2 = bottom_blob->w;
  _h = bottom_blob->h;
  uVar3 = bottom_blob->c;
  if ((bottom_blob->dims == 2) && (1 < (int)_h && uVar2 == this->weight_data_size / iVar12)) {
    Mat::create(top_blob,iVar12,_h,bottom_blob->elemsize,opt->blob_allocator);
    pvVar7 = top_blob->data;
    local_f8 = -100;
    if ((pvVar7 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      pvVar17 = bottom_blob->data;
      iVar12 = bottom_blob->w;
      iVar4 = top_blob->w;
      sVar8 = top_blob->elemsize;
      uVar20 = 0;
      if (0 < (int)uVar2) {
        uVar20 = (ulong)uVar2;
      }
      local_f8 = 0;
      uVar3 = this->num_output;
      if (this->num_output < 1) {
        uVar3 = 0;
      }
      sVar9 = bottom_blob->elemsize;
      for (uVar14 = 0; uVar14 != _h; uVar14 = uVar14 + 1) {
        pvVar21 = (this->weight_data).data;
        iVar5 = this->bias_term;
        iVar6 = this->activation_type;
        pvVar10 = (this->bias_data).data;
        pfVar11 = (float *)(this->activation_params).data;
        for (uVar18 = 0; uVar18 != uVar3; uVar18 = uVar18 + 1) {
          if (iVar5 == 0) {
            fVar25 = 0.0;
          }
          else {
            fVar25 = *(float *)((long)pvVar10 + uVar18 * 4);
          }
          for (uVar15 = 0; uVar20 != uVar15; uVar15 = uVar15 + 1) {
            fVar25 = fVar25 + *(float *)((long)pvVar21 + uVar15 * 4) *
                              *(float *)((long)pvVar17 + uVar15 * 4);
          }
          fVar22 = fVar25;
          switch(iVar6) {
          case 1:
            if (fVar25 <= 0.0) {
              fVar22 = 0.0;
            }
            break;
          case 2:
            fVar22 = (float)(~-(uint)(0.0 < fVar25) & (uint)*pfVar11 |
                            -(uint)(0.0 < fVar25) & 0x3f800000) * fVar25;
            break;
          case 3:
            if (fVar25 <= *pfVar11) {
              fVar25 = *pfVar11;
            }
            fVar22 = fVar25;
            if (pfVar11[1] <= fVar25) {
              fVar22 = pfVar11[1];
            }
            break;
          case 4:
            fVar25 = expf(-fVar25);
            fVar22 = 1.0 / (fVar25 + 1.0);
            break;
          case 5:
            fVar22 = expf(fVar25);
            fVar22 = logf(fVar22 + 1.0);
            fVar22 = tanhf(fVar22);
            fVar22 = fVar22 * fVar25;
            break;
          case 6:
            fVar1 = *pfVar11;
            fVar23 = -pfVar11[1] / fVar1;
            fVar22 = 0.0;
            if ((fVar23 <= fVar25) && (fVar22 = fVar25, fVar25 <= fVar23 + 1.0 / fVar1)) {
              fVar22 = (fVar1 * fVar25 + pfVar11[1]) * fVar25;
            }
          }
          *(float *)((long)pvVar7 + uVar18 * 4 + (long)iVar4 * sVar8 * uVar14) = fVar22;
          pvVar21 = (void *)((long)pvVar21 + (long)(int)uVar2 * 4);
        }
        pvVar17 = (void *)((long)pvVar17 + (long)iVar12 * sVar9);
      }
    }
  }
  else {
    Mat::create(top_blob,iVar12,bottom_blob->elemsize,opt->blob_allocator);
    local_f8 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar13 = _h * uVar2;
      local_f8 = 0;
      uVar20 = 0;
      if (0 < (int)uVar13) {
        uVar20 = (ulong)uVar13;
      }
      uVar14 = 0;
      if (0 < (int)uVar3) {
        uVar14 = (ulong)uVar3;
      }
      iVar12 = 0;
      for (lVar16 = 0; lVar16 < this->num_output; lVar16 = lVar16 + 1) {
        if (this->bias_term == 0) {
          fVar25 = 0.0;
        }
        else {
          fVar25 = *(float *)((long)(this->bias_data).data + lVar16 * 4);
        }
        lVar19 = (long)iVar12 << 2;
        for (uVar18 = 0; uVar18 != uVar14; uVar18 = uVar18 + 1) {
          pvVar7 = (this->weight_data).data;
          Mat::channel(&local_78,bottom_blob,(int)uVar18);
          pvVar17 = local_78.data;
          Mat::~Mat(&local_78);
          for (uVar15 = 0; uVar20 != uVar15; uVar15 = uVar15 + 1) {
            fVar25 = fVar25 + *(float *)((long)pvVar7 + uVar15 * 4 + lVar19) *
                              *(float *)((long)pvVar17 + uVar15 * 4);
          }
          lVar19 = lVar19 + (long)(int)uVar13 * 4;
        }
        fVar22 = fVar25;
        switch(this->activation_type) {
        case 1:
          if (fVar25 <= 0.0) {
            fVar22 = 0.0;
          }
          break;
        case 2:
          fVar22 = (float)(~-(uint)(0.0 < fVar25) & *(this->activation_params).data |
                          -(uint)(0.0 < fVar25) & 0x3f800000) * fVar25;
          break;
        case 3:
          pfVar11 = (float *)(this->activation_params).data;
          fVar22 = *pfVar11;
          if (fVar25 <= fVar22) {
            fVar25 = fVar22;
          }
          fVar1 = pfVar11[1];
          fVar22 = fVar25;
          if (fVar1 <= fVar25) {
            fVar22 = fVar1;
          }
          break;
        case 4:
          fVar25 = expf(-fVar25);
          fVar22 = 1.0 / (fVar25 + 1.0);
          break;
        case 5:
          fVar22 = expf(fVar25);
          fVar22 = logf(fVar22 + 1.0);
          fVar22 = tanhf(fVar22);
          fVar22 = fVar22 * fVar25;
          break;
        case 6:
          pfVar11 = (float *)(this->activation_params).data;
          fVar1 = *pfVar11;
          fVar23 = pfVar11[1];
          fVar24 = -fVar23 / fVar1;
          fVar22 = 0.0;
          if ((fVar24 <= fVar25) && (fVar22 = fVar25, fVar25 <= fVar24 + 1.0 / fVar1)) {
            fVar22 = (fVar1 * fVar25 + fVar23) * fVar25;
          }
        }
        *(float *)((long)top_blob->data + lVar16 * 4) = fVar22;
        iVar12 = iVar12 + _h * uVar2 * uVar3;
      }
    }
  }
  return local_f8;
}

Assistant:

int InnerProduct::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    if (bottom_blob.dims == 2 && w == num_input && h > 1)
    {
        // gemm
        top_blob.create(num_output, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* m = bottom_blob.row(j);
            float* outptr = top_blob.row(j);

            for (int p = 0; p < num_output; p++)
            {
                const float* kptr = (const float*)weight_data + w * p;

                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                for (int i = 0; i < w; i++)
                {
                    sum += m[i] * kptr[i];
                }

                outptr[p] = activation_ss(sum, activation_type, activation_params);
            }
        }

        return 0;
    }

    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        // channels
        for (int q = 0; q < channels; q++)
        {
            const float* w = (const float*)weight_data + size * channels * p + size * q;
            const float* m = bottom_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        top_blob[p] = activation_ss(sum, activation_type, activation_params);
    }

    return 0;
}